

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestCase *pTVar1;
  TestInfo *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  bool bVar6;
  pointer ppTVar7;
  ulong uVar8;
  int iVar9;
  pointer ppTVar10;
  pointer pcVar11;
  ulong uVar12;
  
  ppTVar7 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar10 = (this->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar10 != ppTVar7) {
    uVar8 = 0;
    do {
      pTVar1 = ppTVar7[uVar8];
      ppTVar4 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar5 != ppTVar4) {
        uVar12 = 0;
        bVar6 = false;
        do {
          pTVar2 = ppTVar4[uVar12];
          if (pTVar2->matches_filter_ == true) {
            if (!bVar6) {
              printf("%s.",(pTVar1->name_)._M_dataplus._M_p);
              pbVar3 = (pTVar1->type_param_).ptr_;
              if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
                iVar9 = 0x13e752;
                printf("  # %s = ");
                pbVar3 = (pTVar1->type_param_).ptr_;
                if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                  pcVar11 = (char *)0x0;
                }
                else {
                  pcVar11 = (pbVar3->_M_dataplus)._M_p;
                }
                PrintOnOneLine(pcVar11,iVar9);
              }
              putchar(10);
            }
            printf("  %s",(pTVar2->name_)._M_dataplus._M_p);
            pbVar3 = (pTVar2->value_param_).ptr_;
            if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
               && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
              iVar9 = 0x13e75c;
              printf("  # %s = ");
              pbVar3 = (pTVar2->value_param_).ptr_;
              if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                pcVar11 = (char *)0x0;
              }
              else {
                pcVar11 = (pbVar3->_M_dataplus)._M_p;
              }
              PrintOnOneLine(pcVar11,iVar9);
            }
            putchar(10);
            ppTVar4 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppTVar5 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar6 = true;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)ppTVar5 - (long)ppTVar4 >> 3));
        ppTVar7 = (this->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar10 = (this->test_cases_).
                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)ppTVar10 - (long)ppTVar7 >> 3));
  }
  fflush(_stdout);
  return;
}

Assistant:

Message& Message::operator <<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}